

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void IoTHubClientCore_LL_RetrievePropertyComplete
               (DEVICE_TWIN_UPDATE_STATE update_state,uchar *payLoad,size_t size,void *ctx)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (ctx == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_RetrievePropertyComplete",0x235,1,"Invalid argument ctx NULL"
                );
      return;
    }
  }
  else if (*(code **)((long)ctx + 0x178) != (code *)0x0) {
    if (update_state == DEVICE_TWIN_UPDATE_COMPLETE) {
      *(undefined1 *)((long)ctx + 0x1a4) = 1;
    }
    else if ((*(byte *)((long)ctx + 0x1a4) & 1) == 0) {
      return;
    }
    (**(code **)((long)ctx + 0x178))();
    return;
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_RetrievePropertyComplete(DEVICE_TWIN_UPDATE_STATE update_state, const unsigned char* payLoad, size_t size, void* ctx)
{
    if (ctx == NULL)
    {
        LogError("Invalid argument ctx NULL");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        if (handleData->deviceTwinCallback)
        {
            if (update_state == DEVICE_TWIN_UPDATE_COMPLETE)
            {
                handleData->complete_twin_update_encountered = true;
            }
            if (handleData->complete_twin_update_encountered)
            {
                handleData->deviceTwinCallback(update_state, payLoad, size, handleData->deviceTwinContextCallback);
            }
        }
    }
}